

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::
     VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>
     ::Update<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,Vector *state_vector,
               idx_t count)

{
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  bool bVar8;
  string_t new_value;
  string_t new_value_00;
  SelectionVector sel;
  Vector sort_key;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  Vector sliced_input;
  sel_t assign_sel [2048];
  char *local_2230;
  SelectionVector local_2228;
  Vector *local_2210;
  long local_2208;
  LogicalType local_2200 [24];
  undefined1 local_21e8 [32];
  long local_21c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_21b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2188;
  long *local_2178;
  long local_2170;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2138;
  long *local_2130;
  long local_2128;
  long local_2120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20f0;
  long *local_20e8 [2];
  long local_20d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20a8;
  Vector local_20a0 [8];
  LogicalType local_2098 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2068;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2050;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2040;
  sel_t local_2038 [2050];
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_20e8);
  duckdb::Vector::ToUnifiedFormat((ulong)inputs,(UnifiedVectorFormat *)count);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_2130);
  duckdb::Vector::ToUnifiedFormat((ulong)(inputs + 0x68),(UnifiedVectorFormat *)count);
  local_2208 = local_2128;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_2178);
  local_2210 = inputs;
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  if (count == 0) {
    uVar5 = 0;
  }
  else {
    local_2230 = (char *)0x0;
    uVar5 = 0;
    uVar6 = 0;
    do {
      uVar3 = uVar6;
      if (*local_2130 != 0) {
        uVar3 = (ulong)*(uint *)(*local_2130 + uVar6 * 4);
      }
      if ((local_2120 == 0) ||
         ((*(ulong *)(local_2120 + (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) != 0)) {
        puVar7 = (undefined8 *)(local_2208 + uVar3 * 0x10);
        local_21e8._0_8_ = *puVar7;
        local_21e8._8_8_ = puVar7[1];
        uVar3 = uVar6;
        if (*local_20e8[0] != 0) {
          uVar3 = (ulong)*(uint *)(*local_20e8[0] + uVar6 * 4);
        }
        if (local_20d8 == 0) {
          bVar8 = true;
        }
        else {
          bVar8 = (*(ulong *)(local_20d8 + (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) != 0;
        }
        lVar4 = *local_2178;
        uVar3 = uVar6;
        if (lVar4 != 0) {
          uVar3 = (ulong)*(uint *)(lVar4 + uVar6 * 4);
        }
        pcVar1 = *(char **)(local_2170 + uVar3 * 8);
        if ((*pcVar1 != '\x01') ||
           (bVar2 = string_t::StringComparisonOperators::GreaterThan
                              ((string_t *)(pcVar1 + 0x18),(string_t *)local_21e8), bVar2)) {
          new_value.value.pointer.ptr = (char *)lVar4;
          new_value.value._0_8_ = local_21e8._8_8_;
          ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                    ((ArgMinMaxStateBase *)(pcVar1 + 0x18),(string_t *)local_21e8._0_8_,new_value);
          pcVar1[1] = bVar8 ^ 1;
          if (bVar8 != false) {
            lVar4 = uVar5 - (pcVar1 == local_2230);
            local_2038[lVar4] = (sel_t)uVar6;
            uVar5 = lVar4 + 1;
            local_2230 = pcVar1;
          }
          *pcVar1 = '\x01';
        }
      }
      uVar6 = uVar6 + 1;
    } while (count != uVar6);
  }
  if (uVar5 != 0) {
    duckdb::LogicalType::LogicalType(local_2200,BLOB);
    duckdb::Vector::Vector((Vector *)local_21e8,local_2200,0x800);
    duckdb::LogicalType::~LogicalType(local_2200);
    local_2228.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2228.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_2228.sel_vector = local_2038;
    duckdb::Vector::Vector(local_20a0,local_2210,&local_2228,uVar5);
    duckdb::CreateSortKeyHelpers::CreateSortKey
              (local_20a0,uVar5,(OrderModifiers)0x302,(Vector *)local_21e8);
    puVar7 = (undefined8 *)(local_21c8 + 8);
    uVar6 = 0;
    do {
      uVar3 = uVar6;
      if (local_2228.sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)local_2228.sel_vector[uVar6];
      }
      lVar4 = *local_2178;
      if (lVar4 != 0) {
        uVar3 = (ulong)*(uint *)(lVar4 + uVar3 * 4);
      }
      new_value_00.value.pointer.ptr = (char *)lVar4;
      new_value_00.value._0_8_ = *puVar7;
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                ((ArgMinMaxStateBase *)(*(long *)(local_2170 + uVar3 * 8) + 8),
                 (string_t *)puVar7[-1],new_value_00);
      uVar6 = uVar6 + 1;
      puVar7 = puVar7 + 2;
    } while (uVar5 + (uVar5 == 0) != uVar6);
    if (local_2040 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2040);
    }
    if (local_2050 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2050);
    }
    if (local_2068 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2068);
    }
    duckdb::LogicalType::~LogicalType(local_2098);
    if (local_2228.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2228.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_2188 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2188);
    }
    if (local_2198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2198);
    }
    if (local_21b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_21b0);
    }
    duckdb::LogicalType::~LogicalType((LogicalType *)(local_21e8 + 8));
  }
  if (local_2138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2138);
  }
  if (local_2158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2158);
  }
  if (local_20f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20f0);
  }
  if (local_2110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2110);
  }
  if (local_20a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20a8);
  }
  if (local_20c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20c8);
  }
  return;
}

Assistant:

static void Update(Vector inputs[], AggregateInputData &, idx_t input_count, Vector &state_vector, idx_t count) {
		auto &arg = inputs[0];
		UnifiedVectorFormat adata;
		arg.ToUnifiedFormat(count, adata);

		using ARG_TYPE = typename STATE::ARG_TYPE;
		using BY_TYPE = typename STATE::BY_TYPE;
		auto &by = inputs[1];
		UnifiedVectorFormat bdata;
		auto extra_state = UPDATE_TYPE::CreateExtraState(count);
		UPDATE_TYPE::PrepareData(by, count, extra_state, bdata);
		const auto bys = UnifiedVectorFormat::GetData<BY_TYPE>(bdata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		STATE *last_state = nullptr;
		sel_t assign_sel[STANDARD_VECTOR_SIZE];
		idx_t assign_count = 0;

		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto bidx = bdata.sel->get_index(i);
			if (!bdata.validity.RowIsValid(bidx)) {
				continue;
			}
			const auto bval = bys[bidx];

			const auto aidx = adata.sel->get_index(i);
			const auto arg_null = !adata.validity.RowIsValid(aidx);
			if (IGNORE_NULL && arg_null) {
				continue;
			}

			const auto sidx = sdata.sel->get_index(i);
			auto &state = *states[sidx];
			if (!state.is_initialized || COMPARATOR::template Operation<BY_TYPE>(bval, state.value)) {
				STATE::template AssignValue<BY_TYPE>(state.value, bval);
				state.arg_null = arg_null;
				// micro-adaptivity: it is common we overwrite the same state repeatedly
				// e.g. when running arg_max(val, ts) and ts is sorted in ascending order
				// this check essentially says:
				// "if we are overriding the same state as the last row, the last write was pointless"
				// hence we skip the last write altogether
				if (!arg_null) {
					if (&state == last_state) {
						assign_count--;
					}
					assign_sel[assign_count++] = UnsafeNumericCast<sel_t>(i);
					last_state = &state;
				}
				state.is_initialized = true;
			}
		}
		if (assign_count == 0) {
			// no need to assign anything: nothing left to do
			return;
		}
		Vector sort_key(LogicalType::BLOB);
		auto modifiers = OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST);
		// slice with a selection vector and generate sort keys
		SelectionVector sel(assign_sel);
		Vector sliced_input(arg, sel, assign_count);
		CreateSortKeyHelpers::CreateSortKey(sliced_input, assign_count, modifiers, sort_key);
		auto sort_key_data = FlatVector::GetData<string_t>(sort_key);

		// now assign sort keys
		for (idx_t i = 0; i < assign_count; i++) {
			const auto sidx = sdata.sel->get_index(sel.get_index(i));
			auto &state = *states[sidx];
			STATE::template AssignValue<ARG_TYPE>(state.arg, sort_key_data[i]);
		}
	}